

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status
fdb_open_custom_cmp(fdb_file_handle **ptr_fhandle,char *filename,fdb_config *fconfig,
                   size_t num_functions,char **kvs_names,fdb_custom_cmp_variable *functions,
                   void **user_params)

{
  bool bVar1;
  fdb_status fVar2;
  void *__ptr;
  undefined8 *__ptr_00;
  void *in_RDX;
  undefined8 *in_RDI;
  fdb_status fs;
  fdb_config *in_stack_000000e8;
  fdb_kvs_handle *handle;
  fdb_file_handle *fhandle;
  fdb_config config;
  fdb_config *in_stack_00001a30;
  fdb_filename_mode_t in_stack_00001a3c;
  char *in_stack_00001a40;
  fdb_kvs_handle *in_stack_00001a48;
  uint in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  uint8_t initial;
  fdb_file_handle *in_stack_fffffffffffffdb0;
  fdb_custom_cmp_variable *in_stack_fffffffffffffdb8;
  char **in_stack_fffffffffffffdc0;
  size_t in_stack_fffffffffffffdc8;
  fdb_file_handle *in_stack_fffffffffffffdd0;
  void *in_stack_fffffffffffffdd8;
  filemgr *in_stack_fffffffffffffde0;
  undefined1 local_130 [64];
  byte local_f0;
  void *local_20;
  undefined8 *local_10;
  fdb_status local_4;
  
  local_10 = in_RDI;
  if (in_RDX == (void *)0x0) {
    get_default_config();
    initial = (uint8_t)((uint)in_stack_fffffffffffffdac >> 0x18);
    memcpy(local_130,&stack0xfffffffffffffdc8,0xf8);
  }
  else {
    local_20 = in_RDX;
    bVar1 = validate_fdb_config((fdb_config *)
                                CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    initial = (uint8_t)((uint)in_stack_fffffffffffffdac >> 0x18);
    if (!bVar1) {
      return FDB_RESULT_INVALID_CONFIG;
    }
    memcpy(local_130,local_20,0xf8);
  }
  if ((local_f0 & 1) == 0) {
    local_4 = FDB_RESULT_INVALID_CONFIG;
  }
  else {
    __ptr = calloc(1,0x28);
    if (__ptr == (void *)0x0) {
      local_4 = FDB_RESULT_ALLOC_FAIL;
    }
    else {
      __ptr_00 = (undefined8 *)calloc(1,0x208);
      if (__ptr_00 == (undefined8 *)0x0) {
        free(__ptr);
        local_4 = FDB_RESULT_ALLOC_FAIL;
      }
      else {
        pthread_spin_lock(&initial_lock);
        fdb_open_inprog = fdb_open_inprog + 1;
        pthread_spin_unlock(&initial_lock);
        atomic_init_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffdb0,initial);
        __ptr_00[0x35] = 0;
        get_default_kvs_config();
        *__ptr_00 = in_stack_fffffffffffffdb0;
        __ptr_00[1] = in_stack_fffffffffffffdb8;
        __ptr_00[2] = in_stack_fffffffffffffdc0;
        fVar2 = fdb_init(in_stack_000000e8);
        if (fVar2 == FDB_RESULT_SUCCESS) {
          fdb_file_handle_init
                    (in_stack_fffffffffffffdb0,(fdb_kvs_handle *)(ulong)in_stack_fffffffffffffda8);
          fdb_file_handle_parse_cmp_func
                    (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                     in_stack_fffffffffffffdb8,&in_stack_fffffffffffffdb0->root);
          fVar2 = _fdb_open(in_stack_00001a48,in_stack_00001a40,in_stack_00001a3c,in_stack_00001a30)
          ;
          if (fVar2 == FDB_RESULT_SUCCESS) {
            *local_10 = __ptr;
            filemgr_fhandle_add(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
          }
          else {
            *local_10 = 0;
            free(__ptr_00);
            fdb_file_handle_free((fdb_file_handle *)0x152ee6);
          }
          pthread_spin_lock(&initial_lock);
          fdb_open_inprog = fdb_open_inprog - 1;
          pthread_spin_unlock(&initial_lock);
          local_4 = fVar2;
        }
        else {
          free(__ptr_00);
          free(__ptr);
          pthread_spin_lock(&initial_lock);
          fdb_open_inprog = fdb_open_inprog - 1;
          pthread_spin_unlock(&initial_lock);
          local_4 = fVar2;
        }
      }
    }
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_open_custom_cmp(fdb_file_handle **ptr_fhandle,
                               const char *filename,
                               fdb_config *fconfig,
                               size_t num_functions,
                               char **kvs_names,
                               fdb_custom_cmp_variable *functions,
                               void **user_params)
{
#ifdef _MEMPOOL
    mempool_init();
#endif

    fdb_config config;
    fdb_file_handle *fhandle;
    fdb_kvs_handle *handle;

    if (fconfig) {
        if (validate_fdb_config(fconfig)) {
            config = *fconfig;
        } else {
            return FDB_RESULT_INVALID_CONFIG;
        }
    } else {
        config = get_default_config();
    }

    if (config.multi_kv_instances == false) {
        // single KV instance mode does not support customized cmp function
        return FDB_RESULT_INVALID_CONFIG;
    }

    fhandle = (fdb_file_handle*)calloc(1, sizeof(fdb_file_handle));
    if (!fhandle) { // LCOV_EXCL_START
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    handle = (fdb_kvs_handle *) calloc(1, sizeof(fdb_kvs_handle));
    if (!handle) { // LCOV_EXCL_START
        free(fhandle);
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

#ifndef SPIN_INITIALIZER
    init_initial_lock_status();
#endif

    spin_lock(&initial_lock);
    fdb_open_inprog++;
    spin_unlock(&initial_lock);

    atomic_init_uint8_t(&handle->handle_busy, 0);
    handle->shandle = NULL;
    handle->kvs_config = get_default_kvs_config();

    fdb_status fs = fdb_init(fconfig);
    if (fs != FDB_RESULT_SUCCESS) {
        free(handle);
        free(fhandle);
        spin_lock(&initial_lock);
        fdb_open_inprog--;
        spin_unlock(&initial_lock);
        return fs;
    }
    fdb_file_handle_init(fhandle, handle);

    // insert kvs_names and functions into fhandle's list
    fdb_file_handle_parse_cmp_func(fhandle,
                                   num_functions,
                                   kvs_names,
                                   functions,
                                   user_params);

    fs = _fdb_open(handle, filename, FDB_VFILENAME, &config);
    if (fs == FDB_RESULT_SUCCESS) {
        *ptr_fhandle = fhandle;
        filemgr_fhandle_add(handle->file, fhandle);
    } else {
        *ptr_fhandle = NULL;
        free(handle);
        fdb_file_handle_free(fhandle);
    }
    spin_lock(&initial_lock);
    fdb_open_inprog--;
    spin_unlock(&initial_lock);
    return fs;
}